

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O3

void Ivy_FraigParamsDefault(Ivy_FraigParams_t *pParams)

{
  *(undefined8 *)pParams = 0;
  pParams->dSimSatur = 0.0;
  pParams->fPatScores = 0;
  pParams->MaxScore = 0;
  pParams->dActConeRatio = 0.0;
  pParams->fDoSparse = 0;
  pParams->nBTLimitNode = 0;
  *(undefined8 *)&pParams->nBTLimitMiter = 0;
  pParams->dActConeBumpMax = 0.0;
  pParams->fProve = 0;
  pParams->fVerbose = 0;
  pParams->nSimWords = 0x20;
  pParams->dSimSatur = 0.005;
  pParams->MaxScore = 0x19;
  pParams->fDoSparse = 1;
  pParams->dActConeRatio = 0.3;
  pParams->dActConeBumpMax = 10.0;
  pParams->nBTLimitNode = 100;
  pParams->nBTLimitMiter = 500000;
  return;
}

Assistant:

void Ivy_FraigParamsDefault( Ivy_FraigParams_t * pParams )
{
    memset( pParams, 0, sizeof(Ivy_FraigParams_t) );
    pParams->nSimWords        =      32;  // the number of words in the simulation info
    pParams->dSimSatur        =   0.005;  // the ratio of refined classes when saturation is reached
    pParams->fPatScores       =       0;  // enables simulation pattern scoring
    pParams->MaxScore         =      25;  // max score after which resimulation is used
    pParams->fDoSparse        =       1;  // skips sparse functions
//    pParams->dActConeRatio    =    0.05;  // the ratio of cone to be bumped
//    pParams->dActConeBumpMax  =     5.0;  // the largest bump of activity
    pParams->dActConeRatio    =     0.3;  // the ratio of cone to be bumped
    pParams->dActConeBumpMax  =    10.0;  // the largest bump of activity

    pParams->nBTLimitNode     =     100;  // conflict limit at a node
    pParams->nBTLimitMiter    =  500000;  // conflict limit at an output
//    pParams->nBTLimitGlobal   =       0;  // conflict limit global
//    pParams->nInsLimitGlobal  =       0;  // inspection limit global
}